

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O2

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob)

{
  float *pfVar1;
  float fVar2;
  void *pvVar3;
  int i;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int q;
  int iVar8;
  int q_1;
  Mat local_60;
  
  uVar6 = bottom_top_blob->h * bottom_top_blob->w;
  uVar4 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar4;
  }
  iVar5 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar5 = 0;
  }
  if (this->slope == 0.0) {
    for (iVar8 = 0; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_60,bottom_top_blob,iVar8);
      pvVar3 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        pfVar1 = (float *)((long)pvVar3 + uVar4 * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(undefined4 *)((long)pvVar3 + uVar4 * 4) = 0;
        }
      }
    }
  }
  else {
    while (iVar8 = (int)uVar4, iVar8 != iVar5) {
      Mat::channel(&local_60,bottom_top_blob,iVar8);
      pvVar3 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        fVar2 = *(float *)((long)pvVar3 + uVar4 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar3 + uVar4 * 4) = fVar2 * this->slope;
        }
      }
      uVar4 = (ulong)(iVar8 + 1);
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}